

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall trieste::NodeDef::include(NodeDef *this)

{
  bool bVar1;
  runtime_error *this_00;
  element_type *peVar2;
  element_type *peVar3;
  enable_shared_from_this<trieste::NodeDef> local_40 [2];
  Node st;
  NodeDef *this_local;
  
  st.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  scope((NodeDef *)&stack0xffffffffffffffe0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe0);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"No symbol table");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar2 = CLI::std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffe0);
  peVar3 = CLI::std::
           __shared_ptr_access<trieste::SymtabDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trieste::SymtabDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&peVar2->symtab_);
  CLI::std::enable_shared_from_this<trieste::NodeDef>::shared_from_this(local_40);
  std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>::
  emplace_back<std::shared_ptr<trieste::NodeDef>>
            ((vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
              *)&peVar3->includes,(shared_ptr<trieste::NodeDef> *)local_40);
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_40);
  CLI::std::shared_ptr<trieste::NodeDef>::~shared_ptr
            ((shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void include()
    {
      auto st = scope();

      if (!st)
        throw std::runtime_error("No symbol table");

      st->symtab_->includes.emplace_back(shared_from_this());
    }